

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

void __thiscall
draco::OctahedronToolBox::OctahedralCoordsToUnitVector
          (OctahedronToolBox *this,float in_s_scaled,float in_t_scaled,float *out_vector)

{
  float *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar1;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  float d;
  float norm_squared;
  float x_offset;
  float x;
  float z;
  float y;
  float local_40;
  float local_3c;
  float local_38;
  
  std::abs(in_EDI);
  std::abs(in_EDI);
  fVar1 = (1.0 - extraout_XMM0_Da) - extraout_XMM0_Da_00;
  local_38 = -fVar1;
  if (local_38 < 0.0) {
    local_38 = 0.0;
  }
  if (0.0 <= in_XMM0_Da) {
    local_3c = -local_38;
  }
  else {
    local_3c = local_38;
  }
  local_3c = local_3c + in_XMM0_Da;
  if (0.0 <= in_XMM1_Da) {
    local_40 = -local_38;
  }
  else {
    local_40 = local_38;
  }
  local_40 = local_40 + in_XMM1_Da;
  fVar2 = local_40 * local_40 + fVar1 * fVar1 + local_3c * local_3c;
  if (1e-06 <= fVar2) {
    dVar3 = std::sqrt((double)(ulong)(uint)fVar2);
    fVar2 = 1.0 / SUB84(dVar3,0);
    *in_RSI = fVar1 * fVar2;
    in_RSI[1] = local_3c * fVar2;
    in_RSI[2] = local_40 * fVar2;
  }
  else {
    *in_RSI = 0.0;
    in_RSI[1] = 0.0;
    in_RSI[2] = 0.0;
  }
  return;
}

Assistant:

inline void OctahedralCoordsToUnitVector(float in_s_scaled, float in_t_scaled,
                                           float *out_vector) const {
    // Background about the encoding:
    //   A normal is encoded in a normalized space <s, t> depicted below. The
    //   encoding correponds to an octahedron that is unwrapped to a 2D plane.
    //   During encoding, a normal is projected to the surface of the octahedron
    //   and the projection is then unwrapped to the 2D plane. Decoding is the
    //   reverse of this process.
    //   All points in the central diamond are located on triangles on the
    //   right "hemisphere" of the octahedron while all points outside of the
    //   diamond are on the left hemisphere (basically, they would have to be
    //   wrapped along the diagonal edges to form the octahedron). The central
    //   point corresponds to the right most vertex of the octahedron and all
    //   corners of the plane correspond to the left most vertex of the
    //   octahedron.
    //
    // t
    // ^ *-----*-----*
    // | |    /|\    |
    //   |   / | \   |
    //   |  /  |  \  |
    //   | /   |   \ |
    //   *-----*---- *
    //   | \   |   / |
    //   |  \  |  /  |
    //   |   \ | /   |
    //   |    \|/    |
    //   *-----*-----*  --> s

    // Note that the input |in_s_scaled| and |in_t_scaled| are already scaled to
    // <-1, 1> range. This way, the central point is at coordinate (0, 0).
    float y = in_s_scaled;
    float z = in_t_scaled;

    // Remaining coordinate can be computed by projecting the (y, z) values onto
    // the surface of the octahedron.
    const float x = 1.f - std::abs(y) - std::abs(z);

    // |x| is essentially a signed distance from the diagonal edges of the
    // diamond shown on the figure above. It is positive for all points in the
    // diamond (right hemisphere) and negative for all points outside the
    // diamond (left hemisphere). For all points on the left hemisphere we need
    // to update their (y, z) coordinates to account for the wrapping along
    // the edges of the diamond.
    float x_offset = -x;
    x_offset = x_offset < 0 ? 0 : x_offset;

    // This will do nothing for the points on the right hemisphere but it will
    // mirror the (y, z) location along the nearest diagonal edge of the
    // diamond.
    y += y < 0 ? x_offset : -x_offset;
    z += z < 0 ? x_offset : -x_offset;

    // Normalize the computed vector.
    const float norm_squared = x * x + y * y + z * z;
    if (norm_squared < 1e-6) {
      out_vector[0] = 0;
      out_vector[1] = 0;
      out_vector[2] = 0;
    } else {
      const float d = 1.0f / std::sqrt(norm_squared);
      out_vector[0] = x * d;
      out_vector[1] = y * d;
      out_vector[2] = z * d;
    }
  }